

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprinter.cc
# Opt level: O3

string * __thiscall
tinyusdz::to_string_abi_cxx11_(string *__return_storage_ptr__,tinyusdz *this,Reference *v)

{
  stringstream ss;
  string local_1f8;
  string local_1d8;
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  std::operator<<(local_1a8,(AssetPath *)this);
  if (this[0x108] == (tinyusdz)0x1) {
    std::operator<<(local_1a8,(Path *)(this + 0x40));
  }
  std::operator<<(local_1a8,(LayerOffset *)(this + 0x110));
  if (*(long *)(this + 0x148) != 0) {
    local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f8,"customData","");
    print_customData(&local_1d8,(CustomDataType *)(this + 0x120),&local_1f8,0);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_1a8,local_1d8._M_dataplus._M_p,local_1d8._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
      operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
      operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
    }
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

std::string to_string(const Reference &v) {
  std::stringstream ss;

  ss << v.asset_path;
  if (v.prim_path.is_valid()) {
    ss << v.prim_path;
  }

  ss << v.layerOffset;

  if (!v.customData.empty()) {
    // TODO: Indent
    ss << print_customData(v.customData, "customData", /* indent */ 0);
  }

  return ss.str();
}